

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QString,QMimeTypeXMLData>::emplace<QMimeTypeXMLData_const&>
          (QHash<QString,QMimeTypeXMLData> *this,QString *key,QMimeTypeXMLData *args)

{
  Data *pDVar1;
  Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QMimeTypeXMLData local_90;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
LAB_004c0562:
    pDVar2 = *(Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> **)this;
    local_90._0_8_ = pDVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::detached(pDVar2);
      *(Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> **)this = pDVar2;
    }
    pVar3 = (piter)emplace_helper<QMimeTypeXMLData_const&>(this,key,args);
    QHash<QString,_QMimeTypeXMLData>::~QHash((QHash<QString,_QMimeTypeXMLData> *)&local_90);
  }
  else {
    if (1 < *(uint *)&pDVar1->ref) {
      if ((pDVar1 != (Data *)0x0) && (*(uint *)&pDVar1->ref != 0xffffffff)) {
        LOCK();
        pDVar1->ref = (RefCount)(*(uint *)&pDVar1->ref + 1);
        UNLOCK();
      }
      goto LAB_004c0562;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QMimeTypeXMLData_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_004c0749;
    }
    local_90.hasGlobDeleteAll = args->hasGlobDeleteAll;
    local_90.name.d.d = (args->name).d.d;
    local_90.name.d.ptr = (args->name).d.ptr;
    local_90.name.d.size = (args->name).d.size;
    if (&(local_90.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_90.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_90.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.localeComments.d = (args->localeComments).d;
    if ((local_90.localeComments.d != (Data *)0x0) &&
       (((local_90.localeComments.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      ((local_90.localeComments.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_90.localeComments.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.genericIconName.d.d = (args->genericIconName).d.d;
    local_90.genericIconName.d.ptr = (args->genericIconName).d.ptr;
    local_90.genericIconName.d.size = (args->genericIconName).d.size;
    if (&(local_90.genericIconName.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_90.genericIconName.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_90.genericIconName.d.d)->super_QArrayData).ref_)->ref_)._q_value
           .super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.iconName.d.d = (args->iconName).d.d;
    local_90.iconName.d.ptr = (args->iconName).d.ptr;
    local_90.iconName.d.size = (args->iconName).d.size;
    if (&(local_90.iconName.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_90.iconName.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_90.iconName.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.globPatterns.d.d = (args->globPatterns).d.d;
    local_90.globPatterns.d.ptr = (args->globPatterns).d.ptr;
    local_90.globPatterns.d.size = (args->globPatterns).d.size;
    if (local_90.globPatterns.d.d != (Data *)0x0) {
      LOCK();
      ((local_90.globPatterns.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.globPatterns.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + 1;
      UNLOCK();
    }
    pVar3 = (piter)QHash<QString,_QMimeTypeXMLData>::emplace_helper<QMimeTypeXMLData>
                             ((QHash<QString,_QMimeTypeXMLData> *)this,key,&local_90);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_90.globPatterns.d);
    if (&(local_90.iconName.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.iconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.iconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.iconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.iconName.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_90.genericIconName.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.genericIconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           = ((local_90.genericIconName.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.genericIconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_90.genericIconName.d.d)->super_QArrayData,2,0x10);
      }
    }
    QHash<QString,_QString>::~QHash(&local_90.localeComments);
    if (&(local_90.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_90.name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_004c0749:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }